

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

int str_all_space(char *str)

{
  ushort **ppuVar1;
  char *local_20;
  char *p;
  char *str_local;
  
  local_20 = str;
  while( true ) {
    if (*local_20 == '\0') {
      return 1;
    }
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)*local_20] & 0x2000) == 0) break;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

int str_all_space(const char *str) {
  const char *p = str;
  while (*p) {
    if (isspace(*p) == 0) {
      return 0;
    }
    ++p;
  }
  return 1;
}